

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O2

void __thiscall TextReaderTest_ReadString_Test::TestBody(TextReaderTest_ReadString_Test *this)

{
  bool bVar1;
  char *pcVar2;
  NLStringRef data;
  AssertHelper AStack_b8;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  TextReader reader;
  StringRef name;
  
  data.size_ = 0x17;
  data.data_ = "  3:a\nb\nc\n2x\n2:de \n2:fg";
  mp::internal::TextReader<fmt::Locale>::TextReader(&reader,data,(CStringRef)0x22c559);
  name = mp::internal::TextReader<fmt::Locale>::ReadString(&reader);
  fmt::BasicStringRef<char>::to_string_abi_cxx11_(&gtest_expected_message,&name);
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"a\\nb\"","name.to_string()",(char (*) [4])"a\nb",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
               0xb6,pcVar2);
    testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"test:3:1: expected unsigned integer",
               (allocator<char> *)&AStack_b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::internal::TextReader<fmt::Locale>::ReadString(&reader);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [102])
               "Expected: reader.ReadString() throws an exception of type mp::ReadError.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&AStack_b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0xb8,pcVar2);
  testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::internal::TextReader<fmt::Locale>::ReadTillEndOfLine(&reader);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"test:4:2: expected \':\'",
               (allocator<char> *)&AStack_b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::internal::TextReader<fmt::Locale>::ReadString(&reader);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [102])
               "Expected: reader.ReadString() throws an exception of type mp::ReadError.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&AStack_b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0xbb,pcVar2);
  testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::internal::TextReader<fmt::Locale>::ReadTillEndOfLine(&reader);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"test:5:5: expected newline",
               (allocator<char> *)&AStack_b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::internal::TextReader<fmt::Locale>::ReadString(&reader);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [102])
               "Expected: reader.ReadString() throws an exception of type mp::ReadError.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&AStack_b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0xbe,pcVar2);
  testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::internal::TextReader<fmt::Locale>::ReadTillEndOfLine(&reader);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&gtest_expected_message,"test:6:5: expected newline",
               (allocator<char> *)&AStack_b8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::internal::TextReader<fmt::Locale>::ReadString(&reader);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [102])
               "Expected: reader.ReadString() throws an exception of type mp::ReadError.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = "";
  }
  else {
    pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&AStack_b8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/nl-reader-test.cc",
             0xc1,pcVar2);
  testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  mp::internal::TextReader<fmt::Locale>::~TextReader(&reader);
  return;
}

Assistant:

TEST(TextReaderTest, ReadString) {
  TextReader reader("  3:a\nb\nc\n2x\n2:de \n2:fg", "test");
  fmt::StringRef name = reader.ReadString();
  EXPECT_EQ("a\nb", name.to_string());
  EXPECT_THROW_MSG(reader.ReadString(), mp::ReadError,
                   "test:3:1: expected unsigned integer");
  reader.ReadTillEndOfLine();
  EXPECT_THROW_MSG(reader.ReadString(), mp::ReadError,
                   "test:4:2: expected ':'");
  reader.ReadTillEndOfLine();
  EXPECT_THROW_MSG(reader.ReadString(), mp::ReadError,
                   "test:5:5: expected newline");
  reader.ReadTillEndOfLine();
  EXPECT_THROW_MSG(reader.ReadString(), mp::ReadError,
                   "test:6:5: expected newline");
}